

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::removeFormFields
          (QPDFAcroFormDocumentHelper *this,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *to_remove)

{
  QPDFAnnotationObjectHelper *pQVar1;
  undefined8 this_00;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  iterator iVar5;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_01;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  size_type sVar8;
  int at;
  element_type *peVar9;
  _Base_ptr __k;
  QPDFAnnotationObjectHelper *pQVar10;
  _Base_ptr *__k_00;
  QPDFObjectHandle fields;
  QPDFObjectHandle acroform;
  QPDFAnnotationObjectHelper aoh;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  string local_a0;
  _Base_ptr local_80;
  _Base_ptr local_78;
  QPDFObjGen local_70;
  QPDFAnnotationObjectHelper local_68;
  
  QPDF::getRoot((QPDF *)local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"/AcroForm",(allocator<char> *)local_b0);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a0,(string *)local_c0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  bVar2 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_a0);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"/Fields",(allocator<char> *)local_b0);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_c0,&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_c0);
    if (bVar2) {
      local_a0.field_2._8_8_ = &(to_remove->_M_t)._M_impl.super__Rb_tree_header;
      local_a0.field_2._M_allocated_capacity = (size_type)to_remove;
      for (p_Var7 = (to_remove->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          this_00 = local_a0.field_2._M_allocated_capacity,
          p_Var7 != (_Base_ptr)local_a0.field_2._8_8_;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        __k = p_Var7 + 1;
        iVar4 = std::
                _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                ::find(&(((this->m).
                          super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->field_to_annotations)._M_t,(key_type *)__k);
        peVar9 = (this->m).
                 super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if ((_Rb_tree_header *)iVar4._M_node !=
            &(peVar9->field_to_annotations)._M_t._M_impl.super__Rb_tree_header) {
          pQVar1 = (QPDFAnnotationObjectHelper *)iVar4._M_node[1]._M_left;
          local_80 = __k;
          local_78 = p_Var7;
          for (pQVar10 = (QPDFAnnotationObjectHelper *)iVar4._M_node[1]._M_parent; __k = local_80,
              pQVar10 != pQVar1; pQVar10 = pQVar10 + 1) {
            QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_68,pQVar10);
            peVar9 = (this->m).
                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_b0,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_68.super_QPDFObjectHelper.super_BaseHandle);
            local_70 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_b0);
            std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
            ::erase(&(peVar9->annotation_to_field)._M_t,&local_70);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
            QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
          }
          std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
          ::erase(&(((this->m).
                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->field_to_annotations)._M_t,(key_type *)local_80);
          peVar9 = (this->m).
                   super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          p_Var7 = local_78;
        }
        iVar5 = std::
                _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(peVar9->field_to_name)._M_t,(key_type *)__k);
        peVar9 = (this->m).
                 super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if ((_Rb_tree_header *)iVar5._M_node !=
            &(peVar9->field_to_name)._M_t._M_impl.super__Rb_tree_header) {
          __k_00 = &iVar5._M_node[1]._M_parent;
          this_01 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[](&peVar9->name_to_fields,(key_type *)__k_00)->_M_t;
          std::
          _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
          ::erase(this_01,(key_type *)__k);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                   ::operator[](&((this->m).
                                  super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->name_to_fields,(key_type *)__k_00);
          if ((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
            ::erase(&(((this->m).
                       super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->name_to_fields)._M_t,(key_type *)__k_00);
          }
          std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::erase(&(((this->m).
                     super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->field_to_name)._M_t,(key_type *)__k);
        }
      }
      at = 0;
      while( true ) {
        iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_c0);
        if (iVar3 <= at) break;
        QPDFObjectHandle::getArrayItem
                  ((QPDFObjectHandle *)&local_68,(int)(QPDFObjectHandle *)local_c0);
        local_b0._0_8_ = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_68);
        sVar8 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                          ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                           this_00,(key_type *)local_b0);
        if (sVar8 == 0) {
          at = at + 1;
        }
        else {
          QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_c0,at);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68.super_QPDFObjectHelper.super_BaseHandle);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::removeFormFields(std::set<QPDFObjGen> const& to_remove)
{
    auto acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        return;
    }
    auto fields = acroform.getKey("/Fields");
    if (!fields.isArray()) {
        return;
    }

    for (auto const& og: to_remove) {
        auto annotations = m->field_to_annotations.find(og);
        if (annotations != m->field_to_annotations.end()) {
            for (auto aoh: annotations->second) {
                m->annotation_to_field.erase(aoh.getObjectHandle().getObjGen());
            }
            m->field_to_annotations.erase(og);
        }
        auto name = m->field_to_name.find(og);
        if (name != m->field_to_name.end()) {
            m->name_to_fields[name->second].erase(og);
            if (m->name_to_fields[name->second].empty()) {
                m->name_to_fields.erase(name->second);
            }
            m->field_to_name.erase(og);
        }
    }

    int i = 0;
    while (i < fields.getArrayNItems()) {
        auto field = fields.getArrayItem(i);
        if (to_remove.count(field.getObjGen())) {
            fields.eraseItem(i);
        } else {
            ++i;
        }
    }
}